

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

uint32 __thiscall
Process::start(Process *this,String *program,int argc,char **argv,Map<String,_String> *environment)

{
  code *pcVar1;
  long lVar2;
  FILE *__stream;
  usize __envp;
  int iVar3;
  int *piVar4;
  String *pSVar5;
  String *this_00;
  char *pcVar6;
  char *pcVar7;
  char *pcStack_100;
  undefined8 uStack_f8;
  FILE *local_f0;
  char *local_e8;
  char *local_e0;
  Data *local_d8;
  String *local_d0;
  undefined1 local_c1;
  Iterator *local_c0;
  Iterator *local_b8;
  usize local_b0;
  undefined1 local_a1;
  Process *local_a0;
  undefined4 local_98;
  uint32 local_94;
  Iterator IStack_90;
  int r;
  Iterator end;
  Iterator i_1;
  char **ienv;
  undefined1 local_68 [8];
  Array<String> envStringsBuf;
  char **env;
  char **ppcStack_40;
  int i;
  char **args;
  Map<String,_String> *environment_local;
  char **argv_local;
  int argc_local;
  String *program_local;
  Process *this_local;
  
  pSVar5 = (String *)&uStack_f8;
  local_a0 = this;
  if (this->pid == 0) {
    if ((argc == 0) || (ppcStack_40 = argv, argv[argc + -1] != (char *)0x0)) {
      argv_local._4_4_ = argc;
      if (argc == 0) {
        argv_local._4_4_ = 1;
      }
      lVar2 = -((long)argv_local._4_4_ * 8 + 0x17U & 0xfffffffffffffff0);
      pSVar5 = (String *)((long)&uStack_f8 + lVar2);
      *(char **)((long)pSVar5 + (long)argv_local._4_4_ * 8) = (char *)0x0;
      for (env._4_4_ = 1; env._4_4_ < argv_local._4_4_; env._4_4_ = env._4_4_ + 1) {
        *(char **)((long)pSVar5 + (long)env._4_4_ * 8) = argv[env._4_4_];
      }
      *(undefined8 *)((long)&pcStack_100 + lVar2) = 0x104c64;
      pcVar6 = String::operator_cast_to_char_(program);
      *(char **)pSVar5 = pcVar6;
      ppcStack_40 = (char **)pSVar5;
    }
    envStringsBuf._capacity = _environ;
    *(undefined8 *)((long)pSVar5 + -8) = 0x104c85;
    Array<String>::Array((Array<String> *)local_68);
    *(undefined8 *)((long)pSVar5 + -8) = 0x104c8e;
    local_a1 = Map<String,_String>::isEmpty(environment);
    if (!(bool)local_a1) {
      *(undefined8 *)((long)pSVar5 + -8) = 0x104cb3;
      anon_unknown.dwarf_622e::prepareEnv(environment,(Array<String> *)local_68);
      *(undefined8 *)((long)pSVar5 + -8) = 0x104cbe;
      local_b0 = Array<String>::size((Array<String> *)local_68);
      pSVar5 = (String *)((long)pSVar5 - (local_b0 * 8 + 0x17 & 0xfffffffffffffff0));
      envStringsBuf._capacity = (usize)pSVar5;
      pSVar5[-1]._data.ref = 0x104cf8;
      local_b8 = Array<String>::begin((Array<String> *)local_68);
      end.item = local_b8->item;
      pSVar5[-1]._data.ref = 0x104d18;
      local_c0 = Array<String>::end((Array<String> *)local_68);
      IStack_90.item = local_c0->item;
      i_1.item = pSVar5;
      while( true ) {
        pSVar5[-1]._data.ref = 0x104d42;
        local_c1 = Array<String>::Iterator::operator!=(&end,&stack0xffffffffffffff70);
        if (!(bool)local_c1) break;
        pSVar5[-1]._data.ref = 0x104d5f;
        this_00 = Array<String>::Iterator::operator*(&end);
        local_d0 = this_00;
        pSVar5[-1]._data.ref = 0x104d74;
        local_d8 = (Data *)String::operator_cast_to_char_(this_00);
        (i_1.item)->data = local_d8;
        pSVar5[-1]._data.ref = 0x104d9f;
        Array<String>::Iterator::operator++(&end);
        i_1.item = (String *)&(i_1.item)->_data;
      }
      (i_1.item)->data = (Data *)0x0;
    }
    pSVar5[-1]._data.ref = 0x104dcd;
    local_94 = vfork();
    if (local_94 == 0xffffffff) {
      this_local._4_4_ = 0;
    }
    else if (local_94 == 0) {
      pSVar5[-1]._data.ref = 0x104e2c;
      pcVar6 = String::operator_cast_to_char_(program);
      __envp = envStringsBuf._capacity;
      local_e0 = pcVar6;
      pSVar5[-1]._data.ref = 0x104e49;
      iVar3 = execvpe(pcVar6,ppcStack_40,(char **)__envp);
      if (iVar3 == -1) {
        local_f0 = _stderr;
        pSVar5[-1]._data.ref = 0x104e68;
        local_e8 = String::operator_cast_to_char_(program);
        pSVar5[-1]._data.ref = 0x104e76;
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        pSVar5[-1]._data.ref = 0x104e7d;
        pcVar7 = strerror(iVar3);
        pcVar6 = local_e8;
        __stream = local_f0;
        pSVar5[-1]._data.ref = 0x104e9c;
        fprintf(__stream,"%s: %s\n",pcVar6,pcVar7);
        pSVar5[-1]._data.ref = (usize)&UNK_00104ea6;
        _exit(1);
      }
      pSVar5[-1]._data.ref = 0x104ec9;
      uStack_f8._4_4_ =
           Debug::printf("%s:%u: assertion failed: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                         ,0x13d,"false");
      if (uStack_f8._4_4_ != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_local._4_4_ = 0;
      uStack_f8._4_4_ = 0;
    }
    else {
      local_a0->pid = local_94;
      this_local._4_4_ = local_94;
    }
    local_98 = 1;
    pSVar5[-1]._data.ref = 0x104ef8;
    Array<String>::~Array((Array<String> *)local_68);
  }
  else {
    pcStack_100 = (char *)0x104bb4;
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32 Process::start(const String& program, int argc, char* const argv[], const Map<String, String>& environment)
{
#ifdef _WIN32
  return start(Private::getCommandLine(program, argc, argv), environment);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // prepare argv of child
  const char** args;
  if(argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if(!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = program;
  }

  // prepare env of child
  char** env = ::environ;
  Array<String> envStringsBuf;
  if (!environment.isEmpty())
  {
    prepareEnv(environment, envStringsBuf);
    env = (char**)alloca(sizeof(char*) * (envStringsBuf.size() + 1));
    char** ienv = env;
    for (Array<String>::Iterator i = envStringsBuf.begin(), end = envStringsBuf.end(); i != end; ++i)
      *(ienv++) = (char*)(const char*)*i;
    *ienv = 0;
  }

  // start process
  int r = vfork();
  if (r == -1)
    return 0;
  else if (r != 0) // parent
  {
    pid = r;
    return r;
  }
  else // child
  {
    if(execvpe(program, (char* const*)args, env) == -1)
    {
      fprintf(stderr, "%s: %s\n", (const char*)program, strerror(errno));
      _exit(EXIT_FAILURE);
    }
    ASSERT(false); // unreachable
    return 0;
  }
#endif
}